

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorLinearDriveline.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorLinearDriveline::IntToDescriptor
          (ChLinkMotorLinearDriveline *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,
          uint off_L,ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  int iVar1;
  long *plVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)off_L;
  uVar6 = (ulong)off_v;
  ChLinkMateGeneric::IntToDescriptor((ChLinkMateGeneric *)this,off_v,v,R,off_L,L,Qc);
  plVar2 = *(long **)&(this->super_ChLinkMotorLinear).field_0x278;
  (**(code **)(*plVar2 + 0x140))(plVar2,uVar6,v,R,uVar7,L,Qc);
  peVar3 = (this->innershaft2lin).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar3->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x28])
            (peVar3,(ulong)(off_v + 1),v,R,uVar7,L,Qc);
  peVar3 = (this->innershaft2rot).super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar3->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x28])
            (peVar3,(ulong)(off_v + 2),v,R,uVar7,L,Qc);
  iVar1 = (this->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr;
  peVar4 = (this->innerconstraint1lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar4->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x28])
            (peVar4,uVar6,v,R,(ulong)(iVar1 + off_L),L,Qc);
  peVar4 = (this->innerconstraint2lin).
           super___shared_ptr<chrono::ChShaftsBodyTranslation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar4->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x28])
            (peVar4,uVar6,v,R,(ulong)(iVar1 + 1 + off_L),L,Qc);
  peVar5 = (this->innerconstraint2rot).
           super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar5->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x28])
            (peVar5,uVar6,v,R,(ulong)(iVar1 + 2 + off_L),L);
  return;
}

Assistant:

void ChLinkMotorLinearDriveline::IntToDescriptor(const unsigned int off_v,
                                   const ChStateDelta& v,
                                   const ChVectorDynamic<>& R,
                                   const unsigned int off_L,
                                   const ChVectorDynamic<>& L,
                                   const ChVectorDynamic<>& Qc) {
    // First, inherit to parent class
    ChLinkMotorLinear::IntToDescriptor(off_v, v, R, off_L, L, Qc);

    innershaft1lin->IntToDescriptor(off_v, v, R, off_L, L, Qc);
    innershaft2lin->IntToDescriptor(off_v + 1, v, R, off_L, L, Qc);
    innershaft2rot->IntToDescriptor(off_v + 2, v, R, off_L, L, Qc);
    int nc = mask.nconstr;
    innerconstraint1lin->IntToDescriptor(off_v, v, R, off_L + nc + 0, L, Qc);
    innerconstraint2lin->IntToDescriptor(off_v, v, R, off_L + nc + 1, L, Qc);
    innerconstraint2rot->IntToDescriptor(off_v, v, R, off_L + nc + 2, L, Qc);
}